

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void * build_ir_internal(Context_conflict *ctx,void *_ast)

{
  int iVar1;
  int iVar2;
  MOJOSHADER_irJump *retval;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar3;
  MOJOSHADER_irExpression *pMVar4;
  MOJOSHADER_irExpression *tval;
  MOJOSHADER_irExpression *fval;
  undefined4 *puVar5;
  MOJOSHADER_irExpression *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_irStatement *next;
  uint writemask;
  MOJOSHADER_irBinOpType MVar8;
  int iVar9;
  MOJOSHADER_irConditionType operation;
  MOJOSHADER_astVariableDeclaration *_ast_00;
  MOJOSHADER_astDataTypeType MVar10;
  
  if ((_ast == (void *)0x0) || (ctx->out_of_memory != 0)) {
    return (void *)0x0;
  }
LAB_00144da3:
  ctx->sourcefile = (((MOJOSHADER_astForStatement *)_ast)->ast).filename;
  ctx->sourceline = (((MOJOSHADER_astForStatement *)_ast)->ast).line;
  switch((((MOJOSHADER_astForStatement *)_ast)->ast).type) {
  case MOJOSHADER_AST_OP_PREINCREMENT:
    MVar8 = MOJOSHADER_IR_BINOP_ADD;
    goto LAB_00145312;
  case MOJOSHADER_AST_OP_PREDECREMENT:
    MVar8 = MOJOSHADER_IR_BINOP_SUBTRACT;
LAB_00145312:
    pMVar4 = build_ir_preincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,MVar8);
    return pMVar4;
  case MOJOSHADER_AST_OP_NEGATE:
    pMVar4 = build_ir_increxpr(ctx,(MOJOSHADER_astDataType *)
                                   ((MOJOSHADER_astForStatement *)_ast)->next,-1);
    _ast_00 = *(MOJOSHADER_astVariableDeclaration **)&((MOJOSHADER_astForStatement *)_ast)->unroll;
    goto LAB_001452f2;
  case MOJOSHADER_AST_OP_COMPLEMENT:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    iVar9 = -1;
    goto LAB_00145349;
  case MOJOSHADER_AST_OP_NOT:
    if (**(int **)((long)*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll + 0x18) != 1) {
      __assert_fail("ast->unary.operand->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x155b,"void *build_ir_internal(Context *, void *)");
    }
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    iVar9 = 1;
LAB_00145349:
    pMVar6 = new_ir_constint(ctx,iVar9);
    MVar8 = MOJOSHADER_IR_BINOP_XOR;
    break;
  case MOJOSHADER_AST_OP_POSTINCREMENT:
    MVar8 = MOJOSHADER_IR_BINOP_ADD;
    goto LAB_0014510f;
  case MOJOSHADER_AST_OP_POSTDECREMENT:
    MVar8 = MOJOSHADER_IR_BINOP_SUBTRACT;
LAB_0014510f:
    pMVar4 = build_ir_postincdec(ctx,(MOJOSHADER_astExpressionUnary *)_ast,MVar8);
    return pMVar4;
  case MOJOSHADER_AST_OP_CAST:
    pMVar4 = build_ir_convert(ctx,(MOJOSHADER_astExpressionCast *)_ast);
    return pMVar4;
  default:
    __assert_fail("0 && \"unexpected type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1607,"void *build_ir_internal(Context *, void *)");
  case MOJOSHADER_AST_OP_COMMA:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar7 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar7 == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      (pMVar7->ir).type = MOJOSHADER_IR_EXPR_STMT;
      (pMVar7->ir).filename = ctx->sourcefile;
      (pMVar7->ir).line = ctx->sourceline;
      (pMVar7->move).dst = pMVar4;
    }
    pMVar4 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    pMVar4 = new_ir_eseq(ctx,pMVar7,pMVar4);
    return pMVar4;
  case MOJOSHADER_AST_OP_MULTIPLY:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar8 = MOJOSHADER_IR_BINOP_MULTIPLY;
    break;
  case MOJOSHADER_AST_OP_DIVIDE:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar8 = MOJOSHADER_IR_BINOP_DIVIDE;
    break;
  case MOJOSHADER_AST_OP_MODULO:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar8 = MOJOSHADER_IR_BINOP_MODULO;
    break;
  case MOJOSHADER_AST_OP_ADD:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar8 = MOJOSHADER_IR_BINOP_ADD;
    break;
  case MOJOSHADER_AST_OP_SUBTRACT:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    _ast_00 = ((MOJOSHADER_astForStatement *)_ast)->var_decl;
LAB_001452f2:
    pMVar6 = build_ir_expr(ctx,_ast_00);
    MVar8 = MOJOSHADER_IR_BINOP_SUBTRACT;
    break;
  case MOJOSHADER_AST_OP_LSHIFT:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar8 = MOJOSHADER_IR_BINOP_LSHIFT;
    break;
  case MOJOSHADER_AST_OP_RSHIFT:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar8 = MOJOSHADER_IR_BINOP_RSHIFT;
    break;
  case MOJOSHADER_AST_OP_LESSTHAN:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_LT;
    goto LAB_00145503;
  case MOJOSHADER_AST_OP_GREATERTHAN:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_GT;
    goto LAB_00145503;
  case MOJOSHADER_AST_OP_LESSTHANOREQUAL:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_LEQ;
    goto LAB_00145503;
  case MOJOSHADER_AST_OP_GREATERTHANOREQUAL:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_GEQ;
    goto LAB_00145503;
  case MOJOSHADER_AST_OP_EQUAL:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_EQL;
    goto LAB_00145503;
  case MOJOSHADER_AST_OP_NOTEQUAL:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    tval = new_ir_constbool(ctx,1);
    fval = new_ir_constbool(ctx,0);
    operation = MOJOSHADER_IR_COND_NEQ;
    goto LAB_00145503;
  case MOJOSHADER_AST_OP_BINARYAND:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar8 = MOJOSHADER_IR_BINOP_AND;
    break;
  case MOJOSHADER_AST_OP_BINARYXOR:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar8 = MOJOSHADER_IR_BINOP_XOR;
    break;
  case MOJOSHADER_AST_OP_BINARYOR:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    MVar8 = MOJOSHADER_IR_BINOP_OR;
    break;
  case MOJOSHADER_AST_OP_LOGICALAND:
    iVar9 = 1;
    goto LAB_00145571;
  case MOJOSHADER_AST_OP_LOGICALOR:
    iVar9 = 0;
LAB_00145571:
    pMVar4 = build_ir_logical_and_or(ctx,(MOJOSHADER_astExpressionBinary *)_ast,iVar9);
    return pMVar4;
  case MOJOSHADER_AST_OP_ASSIGN:
    pMVar4 = build_ir_assign(ctx,(MOJOSHADER_astExpressionBinary *)_ast);
    return pMVar4;
  case MOJOSHADER_AST_OP_MULASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_MULTIPLY;
    goto LAB_0014553a;
  case MOJOSHADER_AST_OP_DIVASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_DIVIDE;
    goto LAB_0014553a;
  case MOJOSHADER_AST_OP_MODASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_MODULO;
    goto LAB_0014553a;
  case MOJOSHADER_AST_OP_ADDASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_ADD;
    goto LAB_0014553a;
  case MOJOSHADER_AST_OP_SUBASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_SUBTRACT;
    goto LAB_0014553a;
  case MOJOSHADER_AST_OP_LSHIFTASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_LSHIFT;
    goto LAB_0014553a;
  case MOJOSHADER_AST_OP_RSHIFTASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_RSHIFT;
    goto LAB_0014553a;
  case MOJOSHADER_AST_OP_ANDASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_AND;
    goto LAB_0014553a;
  case MOJOSHADER_AST_OP_XORASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_XOR;
    goto LAB_0014553a;
  case MOJOSHADER_AST_OP_ORASSIGN:
    MVar8 = MOJOSHADER_IR_BINOP_OR;
LAB_0014553a:
    pMVar4 = build_ir_assign_binop(ctx,MVar8,(MOJOSHADER_astExpressionBinary *)_ast);
    return pMVar4;
  case MOJOSHADER_AST_OP_DEREF_ARRAY:
    pMVar4 = build_ir_derefarray(ctx,(MOJOSHADER_astExpressionBinary *)_ast);
    return pMVar4;
  case MOJOSHADER_AST_OP_CONDITIONAL:
    if (**(int **)((long)*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll + 0x18) != 1) {
      __assert_fail("ast->binary.left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1593,"void *build_ir_internal(Context *, void *)");
    }
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar6 = new_ir_constbool(ctx,1);
    tval = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->var_decl);
    fval = build_ir_expr(ctx,((MOJOSHADER_astForStatement *)_ast)->initializer);
    operation = MOJOSHADER_IR_COND_EQL;
LAB_00145503:
    pMVar4 = build_ir_compare(ctx,operation,pMVar4,pMVar6,tval,fval);
    return pMVar4;
  case MOJOSHADER_AST_OP_IDENTIFIER:
    pMVar4 = build_ir_identifier(ctx,(MOJOSHADER_astExpressionIdentifier *)_ast);
    return pMVar4;
  case MOJOSHADER_AST_OP_INT_LITERAL:
    pMVar4 = new_ir_constint(ctx,((MOJOSHADER_astForStatement *)_ast)->unroll);
    return pMVar4;
  case MOJOSHADER_AST_OP_FLOAT_LITERAL:
    pMVar4 = new_ir_constfloat(ctx,(float)*(double *)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    return pMVar4;
  case MOJOSHADER_AST_OP_STRING_LITERAL:
  case MOJOSHADER_AST_COMPUNIT_FUNCTION:
  case MOJOSHADER_AST_COMPUNIT_TYPEDEF:
  case MOJOSHADER_AST_COMPUNIT_STRUCT:
  case MOJOSHADER_AST_COMPUNIT_VARIABLE:
  case MOJOSHADER_AST_FUNCTION_PARAMS:
  case MOJOSHADER_AST_FUNCTION_SIGNATURE:
  case MOJOSHADER_AST_SCALAR_OR_ARRAY:
  case MOJOSHADER_AST_TYPEDEF:
  case MOJOSHADER_AST_PACK_OFFSET:
  case MOJOSHADER_AST_VARIABLE_LOWLEVEL:
  case MOJOSHADER_AST_ANNOTATION:
  case MOJOSHADER_AST_VARIABLE_DECLARATION:
  case MOJOSHADER_AST_STRUCT_DECLARATION:
  case MOJOSHADER_AST_STRUCT_MEMBER:
  case MOJOSHADER_AST_SWITCH_CASE:
  case MOJOSHADER_AST_ARGUMENTS:
    __assert_fail("0 && \"Shouldn\'t hit this in build_ir.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1603,"void *build_ir_internal(Context *, void *)");
  case MOJOSHADER_AST_OP_BOOLEAN_LITERAL:
    pMVar4 = new_ir_constbool(ctx,((MOJOSHADER_astForStatement *)_ast)->unroll);
    return pMVar4;
  case MOJOSHADER_AST_OP_DEREF_STRUCT:
    if (*(int *)&((MOJOSHADER_astForStatement *)_ast)->initializer != 0) {
      pMVar4 = build_ir_swizzle(ctx,(MOJOSHADER_astExpressionDerefStruct *)_ast);
      return pMVar4;
    }
    pMVar4 = build_ir_derefstruct(ctx,(MOJOSHADER_astExpressionDerefStruct *)_ast);
    return pMVar4;
  case MOJOSHADER_AST_OP_CALLFUNC:
    pMVar4 = build_ir_call(ctx,(MOJOSHADER_astExpressionCallFunction *)_ast);
    return pMVar4;
  case MOJOSHADER_AST_OP_CONSTRUCTOR:
    pMVar4 = build_ir_constructor(ctx,(MOJOSHADER_astExpressionConstructor *)_ast);
    return pMVar4;
  case MOJOSHADER_AST_STATEMENT_EMPTY:
  case MOJOSHADER_AST_STATEMENT_TYPEDEF:
  case MOJOSHADER_AST_STATEMENT_STRUCT:
  case MOJOSHADER_AST_STATEMENT_VARDECL:
    goto switchD_00144dc8_caseD_43;
  case MOJOSHADER_AST_STATEMENT_BREAK:
    if (ctx->ir_loop == (LoopLabels *)0x0) {
      __assert_fail("labels != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x15b2,"void *build_ir_internal(Context *, void *)");
    }
    iVar9 = ctx->ir_loop->end;
    goto LAB_001455fb;
  case MOJOSHADER_AST_STATEMENT_CONTINUE:
    if (ctx->ir_loop == (LoopLabels *)0x0) {
      __assert_fail("labels != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x15b9,"void *build_ir_internal(Context *, void *)");
    }
    iVar9 = ctx->ir_loop->start;
LAB_001455fb:
    puVar5 = (undefined4 *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (puVar5 == (undefined4 *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      return (void *)0x0;
    }
    *puVar5 = 0xf;
    *(char **)(puVar5 + 2) = ctx->sourcefile;
    puVar5[4] = ctx->sourceline;
    puVar5[6] = iVar9;
    return puVar5;
  case MOJOSHADER_AST_STATEMENT_DISCARD:
    pMVar7 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x18,ctx->malloc_data);
    if (pMVar7 == (MOJOSHADER_irStatement *)0x0) {
LAB_0014565a:
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      (pMVar7->ir).type = MOJOSHADER_IR_DISCARD;
      (pMVar7->ir).filename = ctx->sourcefile;
      (pMVar7->ir).line = ctx->sourceline;
    }
    goto LAB_00145667;
  case MOJOSHADER_AST_STATEMENT_BLOCK:
    pMVar7 = build_ir_stmt(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    goto LAB_00145667;
  case MOJOSHADER_AST_STATEMENT_EXPRESSION:
    pMVar4 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
    pMVar7 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pMVar7 == (MOJOSHADER_irStatement *)0x0) goto LAB_0014565a;
    (pMVar7->ir).type = MOJOSHADER_IR_EXPR_STMT;
    (pMVar7->ir).filename = ctx->sourcefile;
    (pMVar7->ir).line = ctx->sourceline;
    (pMVar7->move).dst = pMVar4;
LAB_00145667:
    next = build_ir_stmt(ctx,((MOJOSHADER_astForStatement *)_ast)->next);
LAB_0014574e:
    pMVar7 = new_ir_seq(ctx,pMVar7,next);
    return pMVar7;
  case MOJOSHADER_AST_STATEMENT_IF:
    pMVar7 = build_ir_ifstmt(ctx,(MOJOSHADER_astIfStatement *)_ast);
    return pMVar7;
  case MOJOSHADER_AST_STATEMENT_SWITCH:
    pMVar7 = build_ir_switch(ctx,(MOJOSHADER_astSwitchStatement *)_ast);
    return pMVar7;
  case MOJOSHADER_AST_STATEMENT_FOR:
    pMVar7 = build_ir_forstmt(ctx,(MOJOSHADER_astForStatement *)_ast);
    return pMVar7;
  case MOJOSHADER_AST_STATEMENT_DO:
    pMVar7 = build_ir_dostmt(ctx,(MOJOSHADER_astDoStatement *)_ast);
    return pMVar7;
  case MOJOSHADER_AST_STATEMENT_WHILE:
    pMVar7 = build_ir_whilestmt(ctx,(MOJOSHADER_astWhileStatement *)_ast);
    return pMVar7;
  case MOJOSHADER_AST_STATEMENT_RETURN:
    iVar9 = ctx->ir_end;
    if (iVar9 < 0) {
      __assert_fail("label >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x15e4,"void *build_ir_internal(Context *, void *)");
    }
    if (*(long *)&((MOJOSHADER_astForStatement *)_ast)->unroll == 0) {
      pMVar7 = (MOJOSHADER_irStatement *)0x0;
    }
    else {
      dt = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)
                                (*(long *)&((MOJOSHADER_astForStatement *)_ast)->unroll + 0x18));
      pMVar3 = reduce_datatype(ctx,dt);
      MVar10 = pMVar3->type;
      writemask = MVar10 - MOJOSHADER_AST_DATATYPE_ARRAY;
      if (writemask < 4) {
        MVar10 = ((pMVar3->array).base)->type;
      }
      iVar2 = datatype_elems(ctx,dt);
      iVar1 = ctx->ir_ret;
      if (iVar1 < 0) {
        __assert_fail("ctx->ir_ret >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x15ec,"void *build_ir_internal(Context *, void *)");
      }
      pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
      if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        (pMVar4->ir).type = MOJOSHADER_IR_TEMP;
        (pMVar4->ir).filename = ctx->sourcefile;
        (pMVar4->ir).line = ctx->sourceline;
        (pMVar4->info).type = MVar10;
        (pMVar4->info).elements = iVar2;
        (pMVar4->temp).index = iVar1;
      }
      pMVar6 = build_ir_expr(ctx,*(void **)&((MOJOSHADER_astForStatement *)_ast)->unroll);
      pMVar7 = new_ir_move(ctx,pMVar4,pMVar6,writemask);
    }
    next = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (next == (MOJOSHADER_irStatement *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      (next->ir).type = MOJOSHADER_IR_JUMP;
      (next->ir).filename = ctx->sourcefile;
      (next->ir).line = ctx->sourceline;
      (next->jump).label = iVar9;
    }
    goto LAB_0014574e;
  }
  pMVar4 = new_ir_binop(ctx,MVar8,pMVar4,pMVar6);
  return pMVar4;
switchD_00144dc8_caseD_43:
  _ast = ((MOJOSHADER_astForStatement *)_ast)->next;
  if ((MOJOSHADER_astForStatement *)_ast == (MOJOSHADER_astForStatement *)0x0) {
    return (void *)0x0;
  }
  goto LAB_00144da3;
}

Assistant:

static void *build_ir_internal(Context *ctx, void *_ast)
{
    if ((_ast == NULL) || (ctx->out_of_memory))
        return NULL;

    MOJOSHADER_astNode *ast = (MOJOSHADER_astNode *) _ast;

    // upkeep so we report correct error locations...
    ctx->sourcefile = ast->ast.filename;
    ctx->sourceline = ast->ast.line;

    switch (ast->ast.type)
    {
        case MOJOSHADER_AST_OP_PREINCREMENT:  // !!! FIXME: sequence points?
            return build_ir_preincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_ADD);

        case MOJOSHADER_AST_OP_POSTINCREMENT: // !!! FIXME: sequence points?
            return build_ir_postincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_ADD);

        case MOJOSHADER_AST_OP_PREDECREMENT:  // !!! FIXME: sequence points?
            return build_ir_preincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_SUBTRACT);

        case MOJOSHADER_AST_OP_POSTDECREMENT: // !!! FIXME: sequence points?
            return build_ir_postincdec(ctx, &ast->unary, MOJOSHADER_IR_BINOP_SUBTRACT);

        case MOJOSHADER_AST_OP_COMPLEMENT:
            return NEW_IR_BINOP(XOR, build_ir_expr(ctx, ast->unary.operand),
                                new_ir_constint(ctx, 0xFFFFFFFF));

        case MOJOSHADER_AST_OP_NEGATE:  // !!! FIXME: -0.0f != +0.0f
            return NEW_IR_BINOP(SUBTRACT, build_ir_increxpr(ctx, ast->unary.datatype, -1),
                                build_ir_expr(ctx, ast->unary.operand));

        case MOJOSHADER_AST_OP_NOT:  // operand must be bool here!
            assert(ast->unary.operand->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
            return NEW_IR_BINOP(XOR, build_ir_expr(ctx, ast->unary.operand),
                                new_ir_constint(ctx, 1));

        case MOJOSHADER_AST_OP_DEREF_ARRAY:
            return build_ir_derefarray(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_DEREF_STRUCT:
            if (ast->derefstruct.isswizzle)
                return build_ir_swizzle(ctx, &ast->derefstruct);
            return build_ir_derefstruct(ctx, &ast->derefstruct);

        case MOJOSHADER_AST_OP_COMMA:
            // evaluate and throw away left, return right.
            return new_ir_eseq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->binary.left)),
                               build_ir_expr(ctx, ast->binary.right));

        case MOJOSHADER_AST_OP_LESSTHAN: return EASY_IR_COMPARE(LT);
        case MOJOSHADER_AST_OP_GREATERTHAN: return EASY_IR_COMPARE(GT);
        case MOJOSHADER_AST_OP_LESSTHANOREQUAL: return EASY_IR_COMPARE(LEQ);
        case MOJOSHADER_AST_OP_GREATERTHANOREQUAL: return EASY_IR_COMPARE(GEQ);
        case MOJOSHADER_AST_OP_NOTEQUAL: return EASY_IR_COMPARE(NEQ);
        case MOJOSHADER_AST_OP_EQUAL: return EASY_IR_COMPARE(EQL);

        case MOJOSHADER_AST_OP_MULTIPLY: return EASY_IR_BINOP(MULTIPLY);
        case MOJOSHADER_AST_OP_DIVIDE: return EASY_IR_BINOP(DIVIDE);
        case MOJOSHADER_AST_OP_MODULO: return EASY_IR_BINOP(MODULO);
        case MOJOSHADER_AST_OP_ADD: return EASY_IR_BINOP(ADD);
        case MOJOSHADER_AST_OP_SUBTRACT: return EASY_IR_BINOP(SUBTRACT);
        case MOJOSHADER_AST_OP_LSHIFT: return EASY_IR_BINOP(LSHIFT);
        case MOJOSHADER_AST_OP_RSHIFT: return EASY_IR_BINOP(RSHIFT);
        case MOJOSHADER_AST_OP_BINARYAND: return EASY_IR_BINOP(AND);
        case MOJOSHADER_AST_OP_BINARYXOR: return EASY_IR_BINOP(XOR);
        case MOJOSHADER_AST_OP_BINARYOR: return EASY_IR_BINOP(OR);

        case MOJOSHADER_AST_OP_LOGICALAND:
            return build_ir_logical_and(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_LOGICALOR:
            return build_ir_logical_or(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_ASSIGN:
            return build_ir_assign(ctx, &ast->binary);

        case MOJOSHADER_AST_OP_MULASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_MULTIPLY, &ast->binary);
        case MOJOSHADER_AST_OP_DIVASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_DIVIDE, &ast->binary);
        case MOJOSHADER_AST_OP_MODASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_MODULO, &ast->binary);
        case MOJOSHADER_AST_OP_ADDASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_ADD, &ast->binary);
        case MOJOSHADER_AST_OP_SUBASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_SUBTRACT, &ast->binary);
        case MOJOSHADER_AST_OP_LSHIFTASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_LSHIFT, &ast->binary);
        case MOJOSHADER_AST_OP_RSHIFTASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_RSHIFT, &ast->binary);
        case MOJOSHADER_AST_OP_ANDASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_AND, &ast->binary);
        case MOJOSHADER_AST_OP_XORASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_XOR, &ast->binary);
        case MOJOSHADER_AST_OP_ORASSIGN: return build_ir_assign_binop(ctx, MOJOSHADER_IR_BINOP_OR, &ast->binary);

        case MOJOSHADER_AST_OP_CONDITIONAL:
            assert(ast->binary.left->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);
            return build_ir_compare(ctx, MOJOSHADER_IR_COND_EQL,
                                  build_ir_expr(ctx, ast->ternary.left),
                                  new_ir_constbool(ctx, 1),
                                  build_ir_expr(ctx, ast->ternary.center),
                                  build_ir_expr(ctx, ast->ternary.right));

        case MOJOSHADER_AST_OP_IDENTIFIER:
            return build_ir_identifier(ctx, &ast->identifier);

        case MOJOSHADER_AST_OP_INT_LITERAL:
            return new_ir_constint(ctx, ast->intliteral.value);

        case MOJOSHADER_AST_OP_FLOAT_LITERAL:
            return new_ir_constfloat(ctx, ast->floatliteral.value);

        case MOJOSHADER_AST_OP_BOOLEAN_LITERAL:
            return new_ir_constbool(ctx, ast->boolliteral.value);

        case MOJOSHADER_AST_OP_CALLFUNC:
            return build_ir_call(ctx, &ast->callfunc);

        case MOJOSHADER_AST_OP_CONSTRUCTOR:
            return build_ir_constructor(ctx, &ast->constructor);

        case MOJOSHADER_AST_OP_CAST:
            return build_ir_convert(ctx, &ast->cast);

        case MOJOSHADER_AST_STATEMENT_BREAK:
        {
            const LoopLabels *labels = ctx->ir_loop;
            assert(labels != NULL);  // semantic analysis should catch this.
            return new_ir_jump(ctx, labels->end);
        } // case

        case MOJOSHADER_AST_STATEMENT_CONTINUE:
        {
            const LoopLabels *labels = ctx->ir_loop;
            assert(labels != NULL);  // semantic analysis should catch this.
            return new_ir_jump(ctx, labels->start);
        } // case

        case MOJOSHADER_AST_STATEMENT_DISCARD:
            return new_ir_seq(ctx, new_ir_discard(ctx), build_ir_stmt(ctx, ast->discardstmt.next));

        case MOJOSHADER_AST_STATEMENT_EMPTY:
            return build_ir(ctx, ast->stmt.next);  // skip it, do next thing.

        case MOJOSHADER_AST_STATEMENT_EXPRESSION:
            return new_ir_seq(ctx, new_ir_expr_stmt(ctx, build_ir_expr(ctx, ast->exprstmt.expr)), build_ir_stmt(ctx, ast->exprstmt.next));

        case MOJOSHADER_AST_STATEMENT_IF:
            return build_ir_ifstmt(ctx, &ast->ifstmt);

        case MOJOSHADER_AST_STATEMENT_TYPEDEF:  // ignore this, move on.
            return build_ir(ctx, ast->typedefstmt.next);

        case MOJOSHADER_AST_STATEMENT_SWITCH:
            return build_ir_switch(ctx, &ast->switchstmt);

        case MOJOSHADER_AST_STATEMENT_STRUCT:  // ignore this, move on.
            return build_ir(ctx, ast->structstmt.next);

        case MOJOSHADER_AST_STATEMENT_VARDECL: // ignore this, move on.
            return build_ir(ctx, ast->vardeclstmt.next);

        case MOJOSHADER_AST_STATEMENT_BLOCK:
            return new_ir_seq(ctx, build_ir_stmt(ctx, ast->blockstmt.statements), build_ir_stmt(ctx, ast->blockstmt.next));

        case MOJOSHADER_AST_STATEMENT_FOR:
            return build_ir_forstmt(ctx, &ast->forstmt);

        case MOJOSHADER_AST_STATEMENT_DO:
            return build_ir_dostmt(ctx, &ast->dostmt);

        case MOJOSHADER_AST_STATEMENT_WHILE:
            return build_ir_whilestmt(ctx, &ast->whilestmt);

        case MOJOSHADER_AST_STATEMENT_RETURN:
        {
            const int label = ctx->ir_end;
            assert(label >= 0);  // parser should have caught this!
            MOJOSHADER_irStatement *retval = NULL;
            if (ast->returnstmt.expr != NULL)
            {
                // !!! FIXME: whole array/struct returns need to move more into the temp.
                const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->returnstmt.expr->datatype);
                const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
                const int elems = datatype_elems(ctx, dt);
                assert(ctx->ir_ret >= 0);
                retval = new_ir_move(ctx, new_ir_temp(ctx, ctx->ir_ret, type, elems), build_ir_expr(ctx, ast->returnstmt.expr), -1);
            } // if
            return new_ir_seq(ctx, retval, new_ir_jump(ctx, label));
        } // case

        case MOJOSHADER_AST_COMPUNIT_TYPEDEF:
        case MOJOSHADER_AST_COMPUNIT_STRUCT:
        case MOJOSHADER_AST_COMPUNIT_VARIABLE:
        case MOJOSHADER_AST_COMPUNIT_FUNCTION:
        case MOJOSHADER_AST_ARGUMENTS:
        case MOJOSHADER_AST_OP_STRING_LITERAL:
        case MOJOSHADER_AST_SWITCH_CASE:
        case MOJOSHADER_AST_SCALAR_OR_ARRAY:
        case MOJOSHADER_AST_TYPEDEF:
        case MOJOSHADER_AST_FUNCTION_PARAMS:
        case MOJOSHADER_AST_FUNCTION_SIGNATURE:
        case MOJOSHADER_AST_STRUCT_DECLARATION:
        case MOJOSHADER_AST_STRUCT_MEMBER:
        case MOJOSHADER_AST_VARIABLE_DECLARATION:
        case MOJOSHADER_AST_ANNOTATION:
        case MOJOSHADER_AST_PACK_OFFSET:
        case MOJOSHADER_AST_VARIABLE_LOWLEVEL:
            assert(0 && "Shouldn't hit this in build_ir.");
            return NULL;

        default:
            assert(0 && "unexpected type");
            return NULL;
    } // switch
}